

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

ostream * google::protobuf::operator<<(ostream *o,uint128 *b)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  pointer pcVar4;
  uint128 dividend;
  undefined8 uVar5;
  char cVar6;
  ostream oVar7;
  ostream *poVar8;
  ulong uVar9;
  long lVar10;
  uint128 divisor;
  uint128 divisor_00;
  long local_200;
  ostringstream os;
  undefined8 uStack_1f0;
  uint auStack_1e8 [22];
  ios_base local_190 [112];
  char acStack_120 [152];
  undefined1 auStack_88 [8];
  uint128 low;
  uint128 high;
  uint128 mid;
  string rep;
  
  uVar2 = *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18);
  if ((uVar2 & 0x4a) == 8) {
    rep.field_2._8_8_ = 0xf;
    uVar9 = 0x1000000000000000;
  }
  else if ((uVar2 & 0x4a) == 0x40) {
    rep.field_2._8_8_ = 0x15;
    uVar9 = 0x8000000000000000;
  }
  else {
    rep.field_2._8_8_ = 0x13;
    uVar9 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
  *(uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18)) =
       *(uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18)) & 0xffffbdb5 | uVar2 & 0x424a;
  low.hi_ = b->lo_;
  high.lo_ = b->hi_;
  auStack_88 = (undefined1  [8])0x0;
  low.lo_ = 0;
  divisor.hi_ = 0;
  divisor.lo_ = uVar9;
  uint128::DivModImpl(*b,divisor,(uint128 *)&low.hi_,(uint128 *)auStack_88);
  high.hi_ = 0;
  mid.lo_ = 0;
  dividend.hi_ = high.lo_;
  dividend.lo_ = low.hi_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar9;
  uint128::DivModImpl(dividend,divisor_00,(uint128 *)&low.hi_,(uint128 *)&high.hi_);
  uVar5 = rep.field_2._8_8_;
  if (low.hi_ == 0) {
    if (high.hi_ == 0) goto LAB_0017ad9b;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
    puVar1 = (uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    lVar3 = *(long *)(local_200 + -0x18);
    if (acStack_120[lVar3 + 1] == '\0') {
      cVar6 = std::ios::widen((char)lVar3);
      acStack_120[lVar3] = cVar6;
      acStack_120[lVar3 + 1] = '\x01';
    }
    acStack_120[lVar3] = '0';
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
    puVar1 = (uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    lVar3 = *(long *)(local_200 + -0x18);
    if (acStack_120[lVar3 + 1] == '\0') {
      cVar6 = std::ios::widen((char)lVar3);
      acStack_120[lVar3] = cVar6;
      acStack_120[lVar3 + 1] = '\x01';
    }
    acStack_120[lVar3] = '0';
    *(undefined8 *)((long)&uStack_1f0 + *(long *)(local_200 + -0x18)) = uVar5;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
  }
  *(undefined8 *)((long)&uStack_1f0 + *(long *)(local_200 + -0x18)) = uVar5;
LAB_0017ad9b:
  std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
  std::__cxx11::stringbuf::str();
  lVar3 = *(long *)o;
  lVar10 = *(long *)(lVar3 + -0x18);
  pcVar4 = *(pointer *)(o + lVar10 + 0x10);
  *(undefined8 *)(o + lVar10 + 0x10) = 0;
  lVar10 = (long)pcVar4 - (long)rep._M_dataplus._M_p;
  if (rep._M_dataplus._M_p <= pcVar4 && lVar10 != 0) {
    lVar3 = *(long *)(lVar3 + -0x18);
    poVar8 = o + lVar3;
    cVar6 = (char)lVar10;
    if ((uVar2 & 0xb0) == 0x20) {
      if (o[lVar3 + 0xe1] == (ostream)0x0) {
        oVar7 = (ostream)std::ios::widen((char)poVar8);
        poVar8[0xe0] = oVar7;
        poVar8[0xe1] = (ostream)0x1;
      }
      std::__cxx11::string::_M_replace_aux((ulong)&mid.hi_,(ulong)rep._M_dataplus._M_p,0,cVar6);
    }
    else {
      if (o[lVar3 + 0xe1] == (ostream)0x0) {
        oVar7 = (ostream)std::ios::widen((char)poVar8);
        poVar8[0xe0] = oVar7;
        poVar8[0xe1] = (ostream)0x1;
      }
      std::__cxx11::string::insert((ulong)&mid.hi_,0,cVar6);
    }
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(char *)mid.hi_,(long)rep._M_dataplus._M_p);
  if ((size_type *)mid.hi_ != &rep._M_string_length) {
    operator_delete((void *)mid.hi_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
  std::ios_base::~ios_base(local_190);
  return poVar8;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const uint128& b) {
  std::ios_base::fmtflags flags = o.flags();

  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  std::streamsize div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div =
          static_cast<uint64>(PROTOBUF_ULONGLONG(0x1000000000000000));  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = static_cast<uint64>(
          PROTOBUF_ULONGLONG(01000000000000000000000));  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = static_cast<uint64>(
          PROTOBUF_ULONGLONG(10000000000000000000));  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of
  // the original value, each less than "div" and therefore representable
  // as a uint64.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = b;
  uint128 low;
  uint128::DivModImpl(high, div, &high, &low);
  uint128 mid;
  uint128::DivModImpl(high, div, &high, &mid);
  if (high.lo_ != 0) {
    os << high.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << mid.lo_;
    os << std::setw(div_base_log);
  } else if (mid.lo_ != 0) {
    os << mid.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << low.lo_;
  std::string rep = os.str();

  // Add the requisite padding.
  std::streamsize width = o.width(0);
  if (width > rep.size()) {
    if ((flags & std::ios::adjustfield) == std::ios::left) {
      rep.append(width - rep.size(), o.fill());
    } else {
      rep.insert(static_cast<std::string::size_type>(0),
                 width - rep.size(), o.fill());
    }
  }

  // Stream the final representation in a single "<<" call.
  return o << rep;
}